

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void CVodeQuadFree(void *cvode_mem)

{
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  
  if ((in_RDI != (CVodeMem)0x0) && (in_RDI->cv_QuadMallocDone != 0)) {
    cvQuadFreeVectors(in_RDI);
    in_RDI->cv_QuadMallocDone = 0;
    in_RDI->cv_quadr = 0;
  }
  return;
}

Assistant:

void CVodeQuadFree(void* cvode_mem)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) { return; }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_QuadMallocDone)
  {
    cvQuadFreeVectors(cv_mem);
    cv_mem->cv_QuadMallocDone = SUNFALSE;
    cv_mem->cv_quadr          = SUNFALSE;
  }
}